

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O1

size_type __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  uint *puVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  uint *puVar5;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (&this->Set,V);
    return sVar2;
  }
  puVar5 = (uint *)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                   super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  puVar1 = puVar5 + uVar3;
  if (uVar3 != 0) {
    lVar4 = uVar3 << 2;
    do {
      if (*puVar5 == *V) break;
      puVar5 = puVar5 + 1;
      lVar4 = lVar4 + -4;
    } while (lVar4 != 0);
  }
  return (ulong)(puVar5 != puVar1);
}

Assistant:

size_type count(const T &V) const {
    if (isSmall()) {
      // Since the collection is small, just do a linear search.
      return vfind(V) == Vector.end() ? 0 : 1;
    } else {
      return Set.count(V);
    }
  }